

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPool.c
# Opt level: O0

void Acec_ManPool(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  abctime aVar4;
  Vec_Int_t *vAdds_00;
  abctime aVar5;
  Vec_Int_t *p_00;
  Vec_Wec_t *p_01;
  Vec_Int_t *p_02;
  char *pcVar6;
  int local_3c;
  int nFadds;
  int i;
  Vec_Int_t *vAdds;
  abctime clk;
  Vec_Wec_t *vTrees;
  Vec_Int_t *vTree;
  Vec_Int_t *vTops;
  Gia_Man_t *p_local;
  
  aVar4 = Abc_Clock();
  vAdds_00 = Ree_ManComputeCuts(p,(Vec_Int_t **)0x0,1);
  uVar1 = Ree_ManCountFadds(vAdds_00);
  iVar2 = Vec_IntSize(vAdds_00);
  printf("Detected %d FAs and %d HAs.  ",(ulong)uVar1,(ulong)(iVar2 / 6 - uVar1));
  aVar5 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar5 - aVar4);
  aVar4 = Abc_Clock();
  uVar1 = Ree_ManCountFadds(vAdds_00);
  iVar2 = Vec_IntSize(vAdds_00);
  printf("Detected %d FAs and %d HAs.  ",(ulong)uVar1,(ulong)(iVar2 / 6 - uVar1));
  aVar5 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar5 - aVar4);
  p_00 = Acec_ManPoolTopMost(p,vAdds_00);
  uVar1 = Vec_IntSize(p_00);
  iVar2 = Vec_IntSize(p_00);
  pcVar6 = "";
  if (1 < iVar2) {
    pcVar6 = "s";
  }
  printf("Detected %d topmost adder%s.\n",(ulong)uVar1,pcVar6);
  p_01 = Gia_PolynCoreOrderArray(p,vAdds_00,p_00);
  for (local_3c = 0; iVar2 = Vec_WecSize(p_01), local_3c < iVar2; local_3c = local_3c + 1) {
    p_02 = Vec_WecEntry(p_01,local_3c);
    uVar1 = Vec_IntEntry(p_00,local_3c);
    uVar3 = Vec_IntSize(p_02);
    printf("Adder %5d : Tree with %5d nodes.\n",(ulong)uVar1,(ulong)uVar3);
  }
  Vec_WecFree(p_01);
  Vec_IntFree(vAdds_00);
  Vec_IntFree(p_00);
  return;
}

Assistant:

void Acec_ManPool( Gia_Man_t * p )
{
    Vec_Int_t * vTops, * vTree;
    Vec_Wec_t * vTrees;

    abctime clk = Abc_Clock();
    Vec_Int_t * vAdds = Ree_ManComputeCuts( p, NULL, 1 );
    int i, nFadds = Ree_ManCountFadds( vAdds );
    printf( "Detected %d FAs and %d HAs.  ", nFadds, Vec_IntSize(vAdds)/6-nFadds );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    clk = Abc_Clock();
    nFadds = Ree_ManCountFadds( vAdds );
    printf( "Detected %d FAs and %d HAs.  ", nFadds, Vec_IntSize(vAdds)/6-nFadds );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    //Ree_ManPrintAdders( vAdds, 1 );

    // detect topmost nodes
    vTops = Acec_ManPoolTopMost( p, vAdds );
    printf( "Detected %d topmost adder%s.\n", Vec_IntSize(vTops), Vec_IntSize(vTops) > 1 ? "s":"" );

    // collect adder trees
    vTrees = Gia_PolynCoreOrderArray( p, vAdds, vTops );
    Vec_WecForEachLevel( vTrees, vTree, i )
        printf( "Adder %5d : Tree with %5d nodes.\n", Vec_IntEntry(vTops, i), Vec_IntSize(vTree) );

    Vec_WecFree( vTrees );
    Vec_IntFree( vAdds );
    Vec_IntFree( vTops );
}